

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAS.cpp
# Opt level: O0

Pulse __thiscall Storage::Tape::CAS::virtual_get_next_pulse(CAS *this)

{
  size_t sVar1;
  Pulse PVar2;
  int iVar3;
  reference pvVar4;
  byte *pbVar5;
  size_type sVar6;
  size_type sVar7;
  Phase PVar8;
  int bit_offset;
  uint8_t byte_value;
  int bit;
  CAS *this_local;
  int iStack_10;
  Pulse pulse;
  
  Tape::Pulse::Pulse((Pulse *)((long)&this_local + 4));
  pulse.type = 0x2580;
  if ((this->phase_ == Gap) || (this->phase_ == EndOfFile)) {
    iStack_10 = 0x2580;
    this_local._4_4_ = 2;
    if (this->phase_ == Gap) {
      this->phase_ = Header;
      this->distance_into_phase_ = 0;
    }
  }
  else {
    bit_offset = 1;
    if (this->phase_ == Header) {
      this->distance_into_bit_ = this->distance_into_bit_ + 1;
      if (this->distance_into_bit_ == 2) {
        this->distance_into_phase_ = this->distance_into_phase_ + 1;
        this->distance_into_bit_ = 0;
        sVar1 = this->distance_into_phase_;
        pvVar4 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                 ::operator[](&this->chunks_,this->chunk_pointer_);
        iVar3 = 0x1f00;
        if ((pvVar4->long_header & 1U) != 0) {
          iVar3 = 0x7c00;
        }
        if (sVar1 == (long)iVar3) {
          this->phase_ = Bytes;
          this->distance_into_phase_ = 0;
          this->distance_into_bit_ = 0;
        }
      }
    }
    else if (this->phase_ == Bytes) {
      pvVar4 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::
               operator[](&this->chunks_,this->chunk_pointer_);
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar4->data,this->distance_into_phase_ / 0xb);
      iVar3 = (int)this->distance_into_phase_ + (int)(this->distance_into_phase_ / 0xb) * -0xb;
      if (iVar3 == 0) {
        bit_offset = 0;
      }
      else if (iVar3 - 9U < 2) {
        bit_offset = 1;
      }
      else {
        bit_offset = (int)(uint)*pbVar5 >> ((char)iVar3 - 1U & 0x1f) & 1;
      }
      this->distance_into_bit_ = this->distance_into_bit_ + 1;
      iVar3 = 2;
      if (bit_offset != 0) {
        iVar3 = 4;
      }
      if (this->distance_into_bit_ == (long)iVar3) {
        this->distance_into_bit_ = 0;
        this->distance_into_phase_ = this->distance_into_phase_ + 1;
        sVar1 = this->distance_into_phase_;
        pvVar4 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                 ::operator[](&this->chunks_,this->chunk_pointer_);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar4->data);
        if (sVar1 == sVar6 * 0xb) {
          this->distance_into_phase_ = 0;
          this->chunk_pointer_ = this->chunk_pointer_ + 1;
          sVar6 = this->chunk_pointer_;
          sVar7 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                  ::size(&this->chunks_);
          if (sVar6 == sVar7) {
            this->phase_ = EndOfFile;
          }
          else {
            pvVar4 = std::
                     vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::
                     operator[](&this->chunks_,this->chunk_pointer_);
            PVar8 = Header;
            if ((pvVar4->has_gap & 1U) != 0) {
              PVar8 = Gap;
            }
            this->phase_ = PVar8;
          }
        }
      }
    }
    iStack_10 = 2 - bit_offset;
    this_local._4_4_ = (uint)((this->distance_into_bit_ & 1) == 0);
  }
  PVar2.length.length = iStack_10;
  PVar2.type = this_local._4_4_;
  PVar2.length.clock_rate = pulse.type;
  return PVar2;
}

Assistant:

Tape::Pulse CAS::virtual_get_next_pulse() {
	Pulse pulse;
	pulse.length.clock_rate = 9600;
	// Clock rate is four times the baud rate (of 2400), because the quickest thing that might need
	// to be communicated is a '1', which is two cycles at the baud rate, i.e. four events:
	// high, low, high, low.

	// If this is a gap, then that terminates a file. If this is already the end
	// of the file then perpetual gaps await.
	if(phase_ == Phase::Gap || phase_ == Phase::EndOfFile) {
		pulse.length.length = pulse.length.clock_rate;
		pulse.type = Pulse::Type::Zero;

		if(phase_ == Phase::Gap) {
			phase_ = Phase::Header;
			distance_into_phase_ = 0;
		}

		return pulse;
	}

	// Determine which bit is now forthcoming.
	int bit = 1;

	switch(phase_) {
		default: break;

		case Phase::Header: {
			// In the header, all bits are 1s, so let the default value stand. Just check whether the
			// header is ended and, if so, move on to bytes.
			distance_into_bit_++;
			if(distance_into_bit_ == 2) {
				distance_into_phase_++;
				distance_into_bit_ = 0;

				// This code always produces a 2400 baud signal; so use the appropriate Red Book-supplied
				// constants to check whether the header has come to an end.
				if(distance_into_phase_ == (chunks_[chunk_pointer_].long_header ? 31744 : 7936)) {
					phase_ = Phase::Bytes;
					distance_into_phase_ = 0;
					distance_into_bit_ = 0;
				}
			}
		} break;

		case Phase::Bytes: {
			// Provide bits with a single '0' start bit and two '1' stop bits.
			uint8_t byte_value = chunks_[chunk_pointer_].data[distance_into_phase_ / 11];
			int bit_offset = distance_into_phase_ % 11;
			switch(bit_offset) {
				case 0:		bit = 0;									break;
				default:	bit = (byte_value >> (bit_offset - 1)) & 1;	break;
				case 9:
				case 10:	bit = 1;									break;
			}

			// If bit is finished, and if all bytes in chunk have been posted then:
			//	- if this is the final chunk then note end of file.
			//	- otherwise, roll onto the next header or gap, depending on whether the next chunk has a gap.
			distance_into_bit_++;
			if(distance_into_bit_ == (bit ? 4 : 2)) {
				distance_into_bit_ = 0;
				distance_into_phase_++;
				if(distance_into_phase_ == chunks_[chunk_pointer_].data.size() * 11) {
					distance_into_phase_ = 0;
					chunk_pointer_++;
					if(chunk_pointer_ == chunks_.size()) {
						phase_ = Phase::EndOfFile;
					} else {
						phase_ = chunks_[chunk_pointer_].has_gap ? Phase::Gap : Phase::Header;
					}
				}
			}
		} break;
	}

	// A '1' is encoded with twice the frequency of a '0'.
	pulse.length.length = unsigned(2 - bit);
	pulse.type = (distance_into_bit_ & 1) ? Pulse::Type::High : Pulse::Type::Low;

	return pulse;
}